

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cansend.c
# Opt level: O2

int main(int argc,char **argv)

{
  uchar dlc;
  int iVar1;
  int __fd;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  int enable_canfx;
  can_raw_vcid_options vcid_opts;
  sockaddr_can addr;
  ifreq ifr;
  
  enable_canfx = 1;
  vcid_opts.flags = '\x02';
  vcid_opts.tx_vcid = '\0';
  vcid_opts.rx_vcid = '\0';
  vcid_opts.rx_vcid_mask = '\0';
  if (argc == 3) {
    iVar1 = parse_canframe(argv[2],&main::cu);
    if (iVar1 != 0) {
      __fd = socket(0x1d,3,1);
      if (__fd < 0) {
        pcVar4 = "socket";
      }
      else {
        strncpy((char *)&ifr,argv[1],0xf);
        ifr.ifr_ifrn.ifrn_name[0xf] = '\0';
        ifr.ifr_ifru.ifru_ivalue = if_nametoindex((char *)&ifr);
        if (ifr.ifr_ifru.ifru_ivalue == 0) {
          pcVar4 = "if_nametoindex";
        }
        else {
          addr.can_addr._8_8_ = 0;
          addr.can_addr.j1939.name = 0;
          addr.can_ifindex = ifr.ifr_ifru.ifru_ivalue;
          addr._0_4_ = 0x1d;
          if (0x10 < iVar1) {
            iVar2 = ioctl(__fd,0x8921,&ifr);
            if (iVar2 < 0) {
              pcVar4 = "SIOCGIFMTU";
              goto LAB_0010145f;
            }
            if (ifr.ifr_ifru.ifru_ivalue == 0x48) {
              iVar2 = setsockopt(__fd,0x65,5,&enable_canfx,4);
              if (iVar2 != 0) {
                pcVar4 = "error when enabling CAN FD support";
                goto LAB_001013b6;
              }
            }
            else if (0x4b < ifr.ifr_ifru.ifru_ivalue) {
              iVar2 = setsockopt(__fd,0x65,7,&enable_canfx,4);
              if (iVar2 != 0) {
                pcVar4 = "error when enabling CAN XL support";
LAB_001013b6:
                puts(pcVar4);
                return 1;
              }
              iVar2 = setsockopt(__fd,0x65,8,&vcid_opts,4);
              if (iVar2 != 0) {
                pcVar4 = "error when enabling CAN XL VCID pass through";
                goto LAB_001013b6;
              }
            }
          }
          if (iVar1 == 0x80c) {
            iVar1 = main::cu.xl.len + 0xc;
          }
          else if (iVar1 == 0x48) {
            dlc = can_fd_len2dlc(main::cu.fd.len);
            main::cu.fd.len = can_fd_dlc2len(dlc);
            iVar1 = 0x48;
          }
          setsockopt(__fd,0x65,1,(void *)0x0,0);
          iVar2 = bind(__fd,(sockaddr *)&addr,0x18);
          if (iVar2 < 0) {
            pcVar4 = "bind";
          }
          else {
            sVar3 = write(__fd,&main::cu,(long)iVar1);
            if (sVar3 == (long)iVar1) {
              close(__fd);
              return 0;
            }
            pcVar4 = "write";
          }
        }
      }
LAB_0010145f:
      perror(pcVar4);
      return 1;
    }
    fwrite("\nWrong CAN-frame format!\n\n",0x1a,1,_stderr);
  }
  print_usage(*argv);
  return 1;
}

Assistant:

int main(int argc, char **argv)
{
	int s; /* can raw socket */
	int required_mtu;
	int mtu;
	int enable_canfx = 1;
	struct sockaddr_can addr;
	struct can_raw_vcid_options vcid_opts = {
		.flags = CAN_RAW_XL_VCID_TX_PASS,
	};
	static cu_t cu;
	struct ifreq ifr;

	/* check command line options */
	if (argc != 3) {
		print_usage(argv[0]);
		return 1;
	}

	/* parse CAN frame */
	required_mtu = parse_canframe(argv[2], &cu);
	if (!required_mtu) {
		fprintf(stderr, "\nWrong CAN-frame format!\n\n");
		print_usage(argv[0]);
		return 1;
	}

	/* open socket */
	if ((s = socket(PF_CAN, SOCK_RAW, CAN_RAW)) < 0) {
		perror("socket");
		return 1;
	}

	strncpy(ifr.ifr_name, argv[1], IFNAMSIZ - 1);
	ifr.ifr_name[IFNAMSIZ - 1] = '\0';
	ifr.ifr_ifindex = if_nametoindex(ifr.ifr_name);
	if (!ifr.ifr_ifindex) {
		perror("if_nametoindex");
		return 1;
	}

	memset(&addr, 0, sizeof(addr));
	addr.can_family = AF_CAN;
	addr.can_ifindex = ifr.ifr_ifindex;

	if (required_mtu > (int)CAN_MTU) {
		/* check if the frame fits into the CAN netdevice */
		if (ioctl(s, SIOCGIFMTU, &ifr) < 0) {
			perror("SIOCGIFMTU");
			return 1;
		}
		mtu = ifr.ifr_mtu;

		if (mtu == (int)CANFD_MTU) {
			/* interface is ok - try to switch the socket into CAN FD mode */
			if (setsockopt(s, SOL_CAN_RAW, CAN_RAW_FD_FRAMES,
				       &enable_canfx, sizeof(enable_canfx))){
				printf("error when enabling CAN FD support\n");
				return 1;
			}
		}

		if (mtu >= (int)CANXL_MIN_MTU) {
			/* interface is ok - try to switch the socket into CAN XL mode */
			if (setsockopt(s, SOL_CAN_RAW, CAN_RAW_XL_FRAMES,
				       &enable_canfx, sizeof(enable_canfx))){
				printf("error when enabling CAN XL support\n");
				return 1;
			}
			/* try to enable the CAN XL VCID pass through mode */
			if (setsockopt(s, SOL_CAN_RAW, CAN_RAW_XL_VCID_OPTS,
				       &vcid_opts, sizeof(vcid_opts))) {
				printf("error when enabling CAN XL VCID pass through\n");
				return 1;
			}
		}
	}

	/* ensure discrete CAN FD length values 0..8, 12, 16, 20, 24, 32, 64 */
	if (required_mtu == CANFD_MTU)
		cu.fd.len = can_fd_dlc2len(can_fd_len2dlc(cu.fd.len));

	/* CAN XL frames need real frame length for sending */
	if (required_mtu == CANXL_MTU)
		required_mtu = CANXL_HDR_SIZE + cu.xl.len;

	/*
	 * disable default receive filter on this RAW socket This is
	 * obsolete as we do not read from the socket at all, but for
	 * this reason we can remove the receive list in the Kernel to
	 * save a little (really a very little!) CPU usage.
	 */
	setsockopt(s, SOL_CAN_RAW, CAN_RAW_FILTER, NULL, 0);

	if (bind(s, (struct sockaddr *)&addr, sizeof(addr)) < 0) {
		perror("bind");
		return 1;
	}

	/* send frame */
	if (write(s, &cu, required_mtu) != required_mtu) {
		perror("write");
		return 1;
	}

	close(s);

	return 0;
}